

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O0

string * trim(string *str)

{
  int iVar1;
  char *pcVar2;
  ulong in_RSI;
  bool bVar3;
  int local_20;
  int local_1c;
  int start;
  int finish;
  string *str_local;
  
  local_1c = std::__cxx11::string::length();
  do {
    local_1c = local_1c + -1;
    bVar3 = false;
    if (-1 < local_1c) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      iVar1 = isspace((int)*pcVar2);
      bVar3 = iVar1 != 0;
    }
  } while (bVar3);
  local_20 = 0;
  while( true ) {
    bVar3 = false;
    if (local_20 <= local_1c) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      iVar1 = isspace((int)*pcVar2);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::substr((ulong)str,in_RSI);
  return str;
}

Assistant:

string trim(string str) {
   int finish = str.length() - 1;
   while (finish >= 0 && isspace(str[finish])) {
      finish--;
   }
   int start = 0;
   while (start <= finish && isspace(str[start])) {
      start++;
   }
   return str.substr(start, finish - start + 1);
}